

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O0

int Cec_SetActivityFactors(Cec_ManSat_t *p,Gia_Obj_t *pObj)

{
  int LevelMax_00;
  int LevelMax;
  int LevelMin;
  float dActConeRatio;
  Gia_Obj_t *pObj_local;
  Cec_ManSat_t *p_local;
  
  veci_resize(&p->pSat->act_vars,0);
  Gia_ManIncrementTravId(p->pAig);
  LevelMax_00 = Gia_ObjLevel(p->pAig,pObj);
  Cec_SetActivityFactors_rec(p,pObj,(int)((float)LevelMax_00 * 0.5),LevelMax_00);
  return 1;
}

Assistant:

int Cec_SetActivityFactors( Cec_ManSat_t * p, Gia_Obj_t * pObj )
{
    float dActConeRatio = 0.5;
    int LevelMin, LevelMax;
    // reset the active variables
    veci_resize(&p->pSat->act_vars, 0);
    // prepare for traversal
    Gia_ManIncrementTravId( p->pAig );
    // determine the min and max level to visit
    assert( dActConeRatio > 0 && dActConeRatio < 1 );
    LevelMax = Gia_ObjLevel(p->pAig,pObj);
    LevelMin = (int)(LevelMax * (1.0 - dActConeRatio));
    // traverse
    Cec_SetActivityFactors_rec( p, pObj, LevelMin, LevelMax );
//Cec_PrintActivity( p );
    return 1;
}